

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcess.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  char *__nptr;
  ulong uVar5;
  int values [10];
  int repeat [10];
  int polls [10];
  uint interruptDelays [10];
  int createNewGroups [10];
  int shares [10];
  char *cmd [4];
  int exceptions [10];
  int in_stack_ffffffffffffde58;
  int local_2178 [12];
  int local_2148 [12];
  int local_2118 [12];
  uint local_20e8 [12];
  int local_20b8 [12];
  int local_2088 [12];
  char *local_2058;
  char *local_2050;
  char *local_2048;
  undefined8 local_2040;
  _union_1457 local_2038;
  sigset_t asStack_2030 [63];
  undefined1 local_38;
  
  if (argc == 2) {
    lVar4 = 8;
LAB_00103268:
    uVar3 = atoi(*(char **)((long)argv + lVar4));
  }
  else {
    uVar3 = 0;
    if ((argc == 3) && (iVar2 = strcmp(argv[1],"run"), uVar3 = 0, iVar2 == 0)) {
      lVar4 = 0x10;
      goto LAB_00103268;
    }
  }
  uVar1 = uVar3 - 1;
  if ((argc != 3) || (9 < uVar1 && (uVar3 != 0x6e && (uVar3 & 0xfffffffe) != 0x6c))) {
    if (uVar1 < 10) {
      local_2038.sa_handler = (__sighandler_t)0x0;
      asStack_2030[0].__val[1] = 0;
      asStack_2030[0].__val[2] = 0;
      asStack_2030[0].__val[0] = 0x100000000;
      asStack_2030[0].__val[3] = 0x300000000;
      local_2178[0] = 0;
      local_2178[4] = 0;
      local_2178[5] = 0;
      local_2178[6] = 0;
      local_2178[7] = 0;
      local_2178[1] = 0x7b;
      local_2178[2] = 1;
      local_2178[3] = 1;
      local_2178[8] = 1;
      local_2178[9] = 1;
      local_2088[4] = 0;
      local_2088[5] = 0;
      local_2088[6] = 0;
      local_2088[7] = 0;
      local_2088[0] = 0;
      local_2088[1] = 0;
      local_2088[2] = 0;
      local_2088[3] = 0;
      local_2088[8] = 1;
      local_2088[9] = 1;
      local_2118[4] = 0;
      local_2118[5] = 0;
      local_2118[8] = 0;
      local_2118[9] = 0;
      local_2118[0] = 0;
      local_2118[1] = 0;
      local_2118[2] = 0;
      local_2118[3] = 0;
      local_2118[6] = 1;
      local_2118[7] = 0;
      local_2148[8] = 1;
      local_2148[9] = 1;
      local_2148[4] = 1;
      local_2148[5] = 1;
      local_2148[6] = 1;
      local_2148[7] = 1;
      local_2148[0] = 0x101;
      local_2148[1] = 1;
      local_2148[2] = 1;
      local_2148[3] = 1;
      local_20b8[4] = 0;
      local_20b8[5] = 0;
      local_20b8[6] = 0;
      local_20b8[7] = 0;
      local_20b8[0] = 0;
      local_20b8[1] = 0;
      local_20b8[2] = 0;
      local_20b8[3] = 0;
      local_20b8[8] = 1;
      local_20b8[9] = 1;
      local_20e8[4] = 0;
      local_20e8[5] = 0;
      local_20e8[6] = 0;
      local_20e8[7] = 0;
      local_20e8[0] = 0;
      local_20e8[1] = 0;
      local_20e8[2] = 0;
      local_20e8[3] = 0;
      local_20e8[8] = 3;
      local_20e8[9] = 2;
      __nptr = getenv("KWSYS_TEST_PROCESS_1_COUNT");
      if ((__nptr != (char *)0x0) &&
         (lVar4 = strtol(__nptr,(char **)0x0,10), lVar4 - 0xbU < 0x7ffffffffffffff4)) {
        local_2148[0] = (int)lVar4;
      }
      local_2058 = *argv;
      local_2050 = "run";
      local_2048 = argv[1];
      local_2040 = 0;
      fprintf(_stdout,"Output on stdout before test %d.\n",(ulong)uVar3);
      fprintf(_stderr,"Output on stderr before test %d.\n",(ulong)uVar3);
      fflush(_stdout);
      fflush(_stderr);
      uVar5 = (ulong)uVar1;
      iVar2 = runChild(&local_2058,*(int *)(&DAT_00107080 + uVar5 * 4),
                       *(int *)((long)&local_2038 + uVar5 * 4),local_2178[uVar5],local_2088[uVar5],
                       *(int *)(&DAT_001070b0 + uVar5 * 4),in_stack_ffffffffffffde58,
                       *(double *)(&DAT_001070e0 + uVar5 * 8),local_2118[uVar5],local_2148[uVar5],0,
                       local_20b8[uVar5],local_20e8[uVar5]);
      fprintf(_stdout,"Output on stdout after test %d.\n",(ulong)uVar3);
      fprintf(_stderr,"Output on stderr after test %d.\n",(ulong)uVar3);
      fflush(_stdout);
      fflush(_stderr);
      return iVar2;
    }
    if ((2 < argc) && (iVar2 = strcmp(argv[1],"0"), iVar2 == 0)) {
      iVar2 = runChild(argv + 2,4,0,0,0,1,in_stack_ffffffffffffde58,0.0,0,1,0,0,0);
      return iVar2;
    }
    fprintf(_stdout,"Usage: %s <test number>\n",*argv);
    return 1;
  }
  if (0x6b < (int)uVar3) {
    if (uVar3 == 0x6d) {
      memset(&local_2038,0,0x98);
      local_2038 = (_union_1457)0x1;
      sigemptyset(asStack_2030);
      iVar2 = sigaction(2,(sigaction *)&local_2038,(sigaction *)0x0);
      if (iVar2 < 0) {
        return 1;
      }
      main_cold_2();
    }
    else if (uVar3 == 0x6c) {
      main_cold_3();
    }
    else {
      if (uVar3 != 0x6e) goto switchD_001032bb_default;
      main_cold_1();
    }
    goto LAB_001036b1;
  }
  switch(uVar1) {
  case 0:
    main_cold_12();
    goto LAB_001036b1;
  case 1:
    main_cold_11();
    local_2038._0_4_ = 0x7b;
    break;
  case 2:
    main_cold_10();
    goto LAB_001036b1;
  case 3:
    main_cold_9();
    goto LAB_001036b1;
  case 4:
    main_cold_8();
    break;
  case 5:
    memset(&local_2038,0x2e,0x2000);
    local_38 = 10;
    do {
      fwrite(&local_2038,1,0x2001,_stdout);
      fflush(_stdout);
    } while( true );
  case 6:
    main_cold_7();
LAB_001036b1:
    local_2038._0_4_ = 0;
    break;
  case 7:
    main_cold_6();
    break;
  case 8:
    main_cold_5();
    break;
  case 9:
    main_cold_4();
    break;
  default:
switchD_001032bb_default:
    fprintf(_stderr,"Invalid test number %d.\n",(ulong)uVar3);
    return 1;
  }
  return local_2038._0_4_;
}

Assistant:

int main(int argc, const char* argv[])
{
  int n = 0;

#ifdef _WIN32
  int i;
  char new_args[10][_MAX_PATH];
  LPWSTR* w_av = CommandLineToArgvW(GetCommandLineW(), &argc);
  for (i = 0; i < argc; i++) {
    kwsysEncoding_wcstombs(new_args[i], w_av[i], _MAX_PATH);
    argv[i] = new_args[i];
  }
  LocalFree(w_av);
#endif

#if 0
    {
    HANDLE out = GetStdHandle(STD_OUTPUT_HANDLE);
    DuplicateHandle(GetCurrentProcess(), out,
                    GetCurrentProcess(), &out, 0, FALSE,
                    DUPLICATE_SAME_ACCESS | DUPLICATE_CLOSE_SOURCE);
    SetStdHandle(STD_OUTPUT_HANDLE, out);
    }
    {
    HANDLE out = GetStdHandle(STD_ERROR_HANDLE);
    DuplicateHandle(GetCurrentProcess(), out,
                    GetCurrentProcess(), &out, 0, FALSE,
                    DUPLICATE_SAME_ACCESS | DUPLICATE_CLOSE_SOURCE);
    SetStdHandle(STD_ERROR_HANDLE, out);
    }
#endif
  if (argc == 2) {
    n = atoi(argv[1]);
  } else if (argc == 3 && strcmp(argv[1], "run") == 0) {
    n = atoi(argv[2]);
  }
  /* Check arguments.  */
  if (((n >= 1 && n <= 10) || n == 108 || n == 109 || n == 110) && argc == 3) {
    /* This is the child process for a requested test number.  */
    switch (n) {
      case 1:
        return test1(argc, argv);
      case 2:
        return test2(argc, argv);
      case 3:
        return test3(argc, argv);
      case 4:
        return test4(argc, argv);
      case 5:
        return test5(argc, argv);
      case 6:
        test6(argc, argv);
        return 0;
      case 7:
        return test7(argc, argv);
      case 8:
        return test8(argc, argv);
      case 9:
        return test9(argc, argv);
      case 10:
        return test10(argc, argv);
      case 108:
        return test8_grandchild(argc, argv);
      case 109:
        return test9_grandchild(argc, argv);
      case 110:
        return test10_grandchild(argc, argv);
    }
    fprintf(stderr, "Invalid test number %d.\n", n);
    return 1;
  } else if (n >= 1 && n <= 10) {
    /* This is the parent process for a requested test number.  */
    int states[10] = {
      kwsysProcess_State_Exited,   kwsysProcess_State_Exited,
      kwsysProcess_State_Expired,  kwsysProcess_State_Exception,
      kwsysProcess_State_Exited,   kwsysProcess_State_Expired,
      kwsysProcess_State_Exited,   kwsysProcess_State_Exited,
      kwsysProcess_State_Expired,  /* Ctrl+C handler test */
      kwsysProcess_State_Exception /* Process group test */
    };
    int exceptions[10] = {
      kwsysProcess_Exception_None,  kwsysProcess_Exception_None,
      kwsysProcess_Exception_None,
#ifdef CRASH_USING_ABORT
      kwsysProcess_Exception_Other,
#else
      kwsysProcess_Exception_Fault,
#endif
      kwsysProcess_Exception_None,  kwsysProcess_Exception_None,
      kwsysProcess_Exception_None,  kwsysProcess_Exception_None,
      kwsysProcess_Exception_None,  kwsysProcess_Exception_Interrupt
    };
    int values[10] = { 0, 123, 1, 1, 0, 0, 0, 0, 1, 1 };
    int shares[10] = { 0, 0, 0, 0, 0, 0, 0, 0, 1, 1 };
    int outputs[10] = { 1, 1, 1, 1, 1, 0, 1, 1, 1, 1 };
    int delays[10] = { 0, 0, 0, 0, 0, 1, 0, 0, 0, 0 };
    double timeouts[10] = { 10, 10, 10, 30, 30, 10, -1, 10, 6, 4 };
    int polls[10] = { 0, 0, 0, 0, 0, 0, 1, 0, 0, 0 };
    int repeat[10] = { 257, 1, 1, 1, 1, 1, 1, 1, 1, 1 };
    int createNewGroups[10] = { 0, 0, 0, 0, 0, 0, 0, 0, 1, 1 };
    unsigned int interruptDelays[10] = { 0, 0, 0, 0, 0, 0, 0, 0, 3, 2 };
    int r;
    const char* cmd[4];
#ifdef _WIN32
    char* argv0 = 0;
#endif
    char* test1IterationsStr = getenv("KWSYS_TEST_PROCESS_1_COUNT");
    if (test1IterationsStr) {
      long int test1Iterations = strtol(test1IterationsStr, 0, 10);
      if (test1Iterations > 10 && test1Iterations != LONG_MAX) {
        repeat[0] = (int)test1Iterations;
      }
    }
#ifdef _WIN32
    if (n == 0 && (argv0 = strdup(argv[0]))) {
      /* Try converting to forward slashes to see if it works.  */
      char* c;
      for (c = argv0; *c; ++c) {
        if (*c == '\\') {
          *c = '/';
        }
      }
      cmd[0] = argv0;
    } else {
      cmd[0] = argv[0];
    }
#else
    cmd[0] = argv[0];
#endif
    cmd[1] = "run";
    cmd[2] = argv[1];
    cmd[3] = 0;
    fprintf(stdout, "Output on stdout before test %d.\n", n);
    fprintf(stderr, "Output on stderr before test %d.\n", n);
    fflush(stdout);
    fflush(stderr);
    r = runChild(cmd, states[n - 1], exceptions[n - 1], values[n - 1],
                 shares[n - 1], outputs[n - 1], delays[n - 1], timeouts[n - 1],
                 polls[n - 1], repeat[n - 1], 0, createNewGroups[n - 1],
                 interruptDelays[n - 1]);
    fprintf(stdout, "Output on stdout after test %d.\n", n);
    fprintf(stderr, "Output on stderr after test %d.\n", n);
    fflush(stdout);
    fflush(stderr);
#if defined(_WIN32)
    free(argv0);
#endif
    return r;
  } else if (argc > 2 && strcmp(argv[1], "0") == 0) {
    /* This is the special debugging test to run a given command
       line.  */
    const char** cmd = argv + 2;
    int state = kwsysProcess_State_Exited;
    int exception = kwsysProcess_Exception_None;
    int value = 0;
    double timeout = 0;
    int r =
      runChild(cmd, state, exception, value, 0, 1, 0, timeout, 0, 1, 0, 0, 0);
    return r;
  } else {
    /* Improper usage.  */
    fprintf(stdout, "Usage: %s <test number>\n", argv[0]);
    return 1;
  }
}